

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mput.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *__stream;
  void *__ptr;
  size_t sVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 in_R8;
  undefined8 in_R9;
  ufile_config cfg;
  ufile_mutipart_state state;
  
  if (argc < 2) {
    printf(anon_var_dwarf_2b);
    exit(1);
  }
  pcVar3 = getenv("UFILE_PUBLIC_KEY");
  pcVar4 = getenv("UFILE_PRIVATE_KEY");
  puts(&DAT_00102184);
  cfg.public_key._0_4_ = SUB84(pcVar3,0);
  cfg.private_key._0_4_ = SUB84(pcVar4,0);
  cfg.file_host._0_4_ = 0x10205d;
  cfg.bucket_host._0_4_ = 0x10204f;
  iVar1 = ufile_sdk_initialize(0);
  if (iVar1 - 200U < 100 || iVar1 == 0) {
    puts(&DAT_0010219f);
    uVar2 = ufile_multiple_upload_init
                      (&state,"echotest2","multiple_upload",anon_var_dwarf_113 + 0x44,in_R8,in_R9,
                       cfg.public_key._0_4_,cfg.private_key._0_4_,cfg.file_host._0_4_,
                       cfg.bucket_host._0_4_);
    if (uVar2 - 200 < 100 || uVar2 == 0) {
      __stream = fopen(argv[1],"rb");
      __ptr = malloc(state.part_size);
      iVar1 = 0;
      do {
        sVar5 = fread(__ptr,1,state.part_size,__stream);
        if (sVar5 == 0) {
          iVar1 = ufile_multiple_upload_finish(&state);
          if (iVar1 - 200U < 100 || iVar1 == 0) {
            puts(&DAT_001021c5);
          }
          else {
            printf(anon_var_dwarf_149,extraout_RDX_01);
          }
          ufile_sdk_cleanup();
          return 0;
        }
        uVar2 = ufile_multiple_upload_part(&state,__ptr,sVar5,iVar1);
        iVar1 = iVar1 + 1;
      } while (uVar2 - 200 < 100 || uVar2 == 0);
      printf(anon_var_dwarf_13f,(ulong)uVar2);
      ufile_multiple_upload_abort(&state);
      ufile_sdk_cleanup();
    }
    else {
      ufile_sdk_cleanup();
      printf(anon_var_dwarf_113,(ulong)uVar2,extraout_RDX_00);
    }
  }
  else {
    ufile_sdk_cleanup();
    printf(anon_var_dwarf_a8,extraout_RDX);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[]){
    if(argc < 2){
        printf("请输入一个文件路径！！！！");
        exit(1);
    }
    struct ufile_config cfg;
    cfg.public_key = getenv("UFILE_PUBLIC_KEY");
    cfg.private_key = getenv("UFILE_PRIVATE_KEY");
    cfg.bucket_host = "api.ucloud.cn";
    cfg.file_host = "cn-bj.ufileos.com";

    printf("正在初始化 SDK ......\n");
    struct ufile_error error;
    error = ufile_sdk_initialize(cfg, 0);
    if(UFILE_HAS_ERROR(error.code)){
        ufile_sdk_cleanup();
        printf("初始化 sdk 失败，错误信息为：%s\n", error.message);
        return 1;
    }

    printf("调用 (mput)分片 上传文件.....\n");
    struct ufile_mutipart_state state;
    error = ufile_multiple_upload_init(&state, "echotest2", "multiple_upload", "");
    if(UFILE_HAS_ERROR(error.code)){
        ufile_sdk_cleanup();
        printf("调用 ufile_multiple_upload_init 失败，错误信息为：%d, %s\n", error.code, error.message);
        return 1;
    }

    FILE *fp = fopen(argv[1], "rb");
    char *buf = malloc(state.part_size);
    int i;
    for(i=0; ; i++){
        size_t nc = fread(buf, 1, state.part_size, fp);
        if(nc == 0){
            break;
        }
        error = ufile_multiple_upload_part(&state, buf, nc, i);
        if(UFILE_HAS_ERROR(error.code)){
            printf("调用 ufile_multiple_upload_part 失败，错误信息为：%d, %s\n", error.code, error.message);
            ufile_multiple_upload_abort(&state);
            ufile_sdk_cleanup();
            return 1;
        }
    }

    error = ufile_multiple_upload_finish(&state);
    if(UFILE_HAS_ERROR(error.code)){
        printf("调用 ufile_multiple_upload_part 失败，错误信息为：%s\n", error.message);
    }else{
        printf("调用 (mput)分片上传成功\n");
    }
    ufile_sdk_cleanup();
    return 0;
}